

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::NumberFormatterImpl::NumberFormatterImpl
          (NumberFormatterImpl *this,MacroProps *macros,bool safe,UErrorCode *status)

{
  MicroPropsGenerator *pMVar1;
  UErrorCode *status_local;
  bool safe_local;
  MacroProps *macros_local;
  NumberFormatterImpl *this_local;
  
  this->fMicroPropsGenerator = (MicroPropsGenerator *)0x0;
  MicroProps::MicroProps(&this->fMicros);
  LocalPointer<const_icu_63::DecimalFormatSymbols>::LocalPointer
            (&this->fSymbols,(DecimalFormatSymbols *)0x0);
  LocalPointer<const_icu_63::PluralRules>::LocalPointer(&this->fRules,(PluralRules *)0x0);
  LocalPointer<const_icu_63::number::impl::ParsedPatternInfo>::LocalPointer
            (&this->fPatternInfo,(ParsedPatternInfo *)0x0);
  LocalPointer<const_icu_63::number::impl::ScientificHandler>::LocalPointer
            (&this->fScientificHandler,(ScientificHandler *)0x0);
  LocalPointer<icu_63::number::impl::MutablePatternModifier>::LocalPointer
            (&this->fPatternModifier,(MutablePatternModifier *)0x0);
  LocalPointer<const_icu_63::number::impl::ImmutablePatternModifier>::LocalPointer
            (&this->fImmutablePatternModifier,(ImmutablePatternModifier *)0x0);
  LocalPointer<const_icu_63::number::impl::LongNameHandler>::LocalPointer
            (&this->fLongNameHandler,(LongNameHandler *)0x0);
  LocalPointer<const_icu_63::number::impl::CompactHandler>::LocalPointer
            (&this->fCompactHandler,(CompactHandler *)0x0);
  Warehouse::Warehouse(&this->fWarehouse);
  pMVar1 = macrosToMicroGenerator(this,macros,safe,status);
  this->fMicroPropsGenerator = pMVar1;
  return;
}

Assistant:

NumberFormatterImpl::NumberFormatterImpl(const MacroProps& macros, bool safe, UErrorCode& status) {
    fMicroPropsGenerator = macrosToMicroGenerator(macros, safe, status);
}